

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnImportFunc
          (BinaryReaderInterp *this,Index import_index,string_view module_name,
          string_view field_name,Index func_index,Index sig_index)

{
  value_type *__x;
  ModuleDesc *pMVar1;
  pointer pFVar2;
  Result RVar3;
  Enum EVar4;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_130;
  string_view field_name_local;
  string_view module_name_local;
  string local_108;
  string local_e8;
  ImportType local_c8;
  Var local_78;
  
  field_name_local.size_ = field_name.size_;
  field_name_local.data_ = field_name.data_;
  module_name_local.size_ = module_name.size_;
  module_name_local.data_ = module_name.data_;
  local_c8.module.field_2._M_allocated_capacity._0_4_ = 0;
  local_c8.module.field_2._4_8_ = 0;
  local_c8.module._M_dataplus._M_p = (pointer)0x0;
  local_c8.module._M_string_length._0_4_ = 0;
  local_c8.module._M_string_length._4_4_ = 0;
  Var::Var(&local_78,sig_index,(Location *)&local_c8);
  RVar3 = SharedValidator::OnFunction
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_78);
  Var::~Var(&local_78);
  if (RVar3.enum_ == Error) {
    EVar4 = Error;
  }
  else {
    pMVar1 = this->module_;
    pFVar2 = (pMVar1->func_types).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    __x = pFVar2 + sig_index;
    string_view::to_string_abi_cxx11_(&local_108,&module_name_local);
    string_view::to_string_abi_cxx11_(&local_e8,&field_name_local);
    (**(code **)((long)pFVar2[sig_index].super_ExternType._vptr_ExternType + 0x10))(&local_130,__x);
    ImportType::ImportType
              (&local_c8,&local_108,&local_e8,
               (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                *)&local_130);
    std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
    emplace_back<wabt::interp::ImportDesc>(&pMVar1->imports,(ImportDesc *)&local_c8);
    ImportType::~ImportType(&local_c8);
    if (local_130._M_head_impl != (ExternType *)0x0) {
      (*(local_130._M_head_impl)->_vptr_ExternType[1])();
    }
    local_130._M_head_impl = (ExternType *)0x0;
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,__x);
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnImportFunc(Index import_index,
                                        string_view module_name,
                                        string_view field_name,
                                        Index func_index,
                                        Index sig_index) {
  CHECK_RESULT(validator_.OnFunction(loc, Var(sig_index)));
  FuncType& func_type = module_.func_types[sig_index];
  module_.imports.push_back(ImportDesc{ImportType(
      module_name.to_string(), field_name.to_string(), func_type.Clone())});
  func_types_.push_back(func_type);
  return Result::Ok;
}